

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode readwrite_upload(SessionHandle *data,connectdata *conn,SingleRequest *k,int *didwhat)

{
  int *piVar1;
  CURLcode CVar2;
  void *pvVar3;
  long lVar4;
  timeval tVar5;
  __time_t local_78;
  __suseconds_t local_70;
  HTTP *http;
  int fillcount;
  _Bool sending_http_headers;
  ssize_t nread;
  char *pcStack_48;
  CURLcode result;
  ssize_t bytes_written;
  ssize_t si;
  ssize_t i;
  int *didwhat_local;
  SingleRequest *k_local;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  http._7_1_ = 0;
  i = (ssize_t)didwhat;
  didwhat_local = (int *)k;
  k_local = (SingleRequest *)conn;
  conn_local = (connectdata *)data;
  if ((k->bytecount == 0) && (k->writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  piVar1 = didwhat_local;
  *(uint *)i = *(uint *)i | 2;
  if (conn_local->proxyuser == (char *)0x0) {
    conn_local->proxypasswd = *(char **)(didwhat_local + 0x3c);
    if ((*(byte *)(didwhat_local + 0x40) & 1) == 0) {
      if ((didwhat_local[0x32] == 2) && (*(int *)(*(long *)&conn_local->rtspversion + 0x78) == 2)) {
        didwhat_local[0x32] = 1;
        didwhat_local[0x3f] = didwhat_local[0x3f] & 0xfffffffd;
        tVar5 = curlx_tvnow();
        local_78 = tVar5.tv_sec;
        *(__time_t *)(piVar1 + 0x2e) = local_78;
        local_70 = tVar5.tv_usec;
        *(__suseconds_t *)(piVar1 + 0x30) = local_70;
        *(uint *)i = *(uint *)i & 0xfffffffd;
        Curl_expire((SessionHandle *)conn_local,*(long *)(conn_local[1].ip_addr_str + 0x18));
        return CURLE_OK;
      }
      if ((*(uint *)(k_local[2].now.tv_usec + 0x78) & 0x40003) != 0) {
        http._7_1_ = *(int *)(*(long *)&conn_local->rtspversion + 0x78) == 1;
      }
      CVar2 = Curl_fillreadbuffer((connectdata *)k_local,0x4000,(int *)&http);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      _fillcount = (char *)(long)(int)http;
      nread._4_4_ = 0;
    }
    else {
      _fillcount = (char *)0x0;
    }
    if ((_fillcount == (char *)0x0) && ((didwhat_local[0x3f] & 0x20U) != 0)) {
      return CURLE_OK;
    }
    if ((long)_fillcount < 1) {
      didwhat_local[0x3f] = didwhat_local[0x3f] & 0xfffffffd;
      if ((k_local[2].bytecount & 0x100000000000000) == 0) {
        return CURLE_OK;
      }
      CVar2 = Curl_readrewind((connectdata *)k_local);
      if (CVar2 == CURLE_OK) {
        return CURLE_OK;
      }
      return CVar2;
    }
    conn_local->proxyuser = _fillcount;
    if ((*(uint *)(k_local[2].now.tv_usec + 0x78) & 0x30000) == 0) {
      if (((http._7_1_ & 1) == 0) &&
         (((conn_local->syserr_buf[0xbb] & 1U) != 0 || ((conn_local->read_pos & 0x10000) != 0)))) {
        if (*(long *)&conn_local[0x16].num_addr == 0) {
          pvVar3 = (*Curl_cmalloc)(0x8000);
          *(void **)&conn_local[0x16].num_addr = pvVar3;
        }
        if (*(long *)&conn_local[0x16].num_addr == 0) {
          Curl_failf((SessionHandle *)conn_local,"Failed to alloc scratch buffer!");
          return CURLE_OUT_OF_MEMORY;
        }
        bytes_written = 0;
        for (si = 0; si < (long)_fillcount; si = si + 1) {
          if (conn_local->proxypasswd[si] == '\n') {
            lVar4 = bytes_written + 1;
            *(undefined1 *)(*(long *)&conn_local[0x16].num_addr + bytes_written) = 0xd;
            *(undefined1 *)(*(long *)&conn_local[0x16].num_addr + lVar4) = 10;
            bytes_written = lVar4;
            if ((conn_local->read_pos & 0x10000) == 0) {
              *(long *)(conn_local[0x16].syserr_buf + 0x90) =
                   *(long *)(conn_local[0x16].syserr_buf + 0x90) + 1;
            }
          }
          else {
            *(char *)(*(long *)&conn_local[0x16].num_addr + bytes_written) =
                 conn_local->proxypasswd[si];
          }
          bytes_written = bytes_written + 1;
        }
        if ((char *)bytes_written != _fillcount) {
          _fillcount = (char *)bytes_written;
          conn_local->proxypasswd = *(char **)&conn_local[0x16].num_addr;
          conn_local->proxyuser = (char *)bytes_written;
        }
      }
    }
    else {
      CVar2 = Curl_smtp_escape_eob((connectdata *)k_local,(ssize_t)_fillcount);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      nread._4_4_ = 0;
    }
  }
  nread._4_4_ = Curl_write((connectdata *)k_local,*(curl_socket_t *)((long)&k_local[2].hbufp + 4),
                           conn_local->proxypasswd,(size_t)conn_local->proxyuser,
                           (ssize_t *)&stack0xffffffffffffffb8);
  if (nread._4_4_ == CURLE_OK) {
    if ((conn_local->syserr_buf[0xd0] & 1U) != 0) {
      Curl_debug((SessionHandle *)conn_local,CURLINFO_DATA_OUT,conn_local->proxypasswd,
                 (size_t)pcStack_48,(connectdata *)k_local);
    }
    *(char **)(didwhat_local + 10) = pcStack_48 + *(long *)(didwhat_local + 10);
    if (*(long *)(didwhat_local + 10) == *(long *)(conn_local[0x16].syserr_buf + 0x90)) {
      *(undefined1 *)(didwhat_local + 0x40) = 1;
      Curl_infof((SessionHandle *)conn_local,"We are completely uploaded and fine\n");
    }
    if (conn_local->proxyuser == pcStack_48) {
      conn_local->proxypasswd = *(char **)(didwhat_local + 0x3c);
      conn_local->proxyuser = (char *)0x0;
      if ((*(byte *)(didwhat_local + 0x40) & 1) != 0) {
        didwhat_local[0x3f] = didwhat_local[0x3f] & 0xfffffffd;
      }
    }
    else {
      conn_local->proxyuser = conn_local->proxyuser + -(long)pcStack_48;
      conn_local->proxypasswd = pcStack_48 + (long)conn_local->proxypasswd;
    }
    Curl_pgrsSetUploadCounter((SessionHandle *)conn_local,*(curl_off_t *)(didwhat_local + 10));
    return CURLE_OK;
  }
  return nread._4_4_;
}

Assistant:

static CURLcode readwrite_upload(struct SessionHandle *data,
                                 struct connectdata *conn,
                                 struct SingleRequest *k,
                                 int *didwhat)
{
  ssize_t i, si;
  ssize_t bytes_written;
  CURLcode result;
  ssize_t nread; /* number of bytes read */
  bool sending_http_headers = FALSE;

  if((k->bytecount == 0) && (k->writebytecount == 0))
    Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  *didwhat |= KEEP_SEND;

  /*
   * We loop here to do the READ and SEND loop until we run out of
   * data to send or until we get EWOULDBLOCK back
   *
   * FIXME: above comment is misleading. Currently no looping is
   * actually done in do-while loop below.
   */
  do {

    /* only read more data if there's no upload data already
       present in the upload buffer */
    if(0 == data->req.upload_present) {
      /* init the "upload from here" pointer */
      data->req.upload_fromhere = k->uploadbuf;

      if(!k->upload_done) {
        /* HTTP pollution, this should be written nicer to become more
           protocol agnostic. */
        int fillcount;
        struct HTTP *http = data->req.protop;

        if((k->exp100 == EXP100_SENDING_REQUEST) &&
           (http->sending == HTTPSEND_BODY)) {
          /* If this call is to send body data, we must take some action:
             We have sent off the full HTTP 1.1 request, and we shall now
             go into the Expect: 100 state and await such a header */
          k->exp100 = EXP100_AWAITING_CONTINUE; /* wait for the header */
          k->keepon &= ~KEEP_SEND;         /* disable writing */
          k->start100 = Curl_tvnow();       /* timeout count starts now */
          *didwhat &= ~KEEP_SEND;  /* we didn't write anything actually */

          /* set a timeout for the multi interface */
          Curl_expire(data, data->set.expect_100_timeout);
          break;
        }

        if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
          if(http->sending == HTTPSEND_REQUEST)
            /* We're sending the HTTP request headers, not the data.
               Remember that so we don't change the line endings. */
            sending_http_headers = TRUE;
          else
            sending_http_headers = FALSE;
        }

        result = Curl_fillreadbuffer(conn, BUFSIZE, &fillcount);
        if(result)
          return result;

        nread = (ssize_t)fillcount;
      }
      else
        nread = 0; /* we're done uploading/reading */

      if(!nread && (k->keepon & KEEP_SEND_PAUSE)) {
        /* this is a paused transfer */
        break;
      }
      else if(nread<=0) {
        /* done */
        k->keepon &= ~KEEP_SEND; /* we're done writing */

        if(conn->bits.rewindaftersend) {
          result = Curl_readrewind(conn);
          if(result)
            return result;
        }
        break;
      }

      /* store number of bytes available for upload */
      data->req.upload_present = nread;

#ifndef CURL_DISABLE_SMTP
      if(conn->handler->protocol & PROTO_FAMILY_SMTP) {
        result = Curl_smtp_escape_eob(conn, nread);
        if(result)
          return result;
      }
      else
#endif /* CURL_DISABLE_SMTP */

      /* convert LF to CRLF if so asked */
      if((!sending_http_headers) && (
#ifdef CURL_DO_LINEEND_CONV
         /* always convert if we're FTPing in ASCII mode */
         (data->set.prefer_ascii) ||
#endif
         (data->set.crlf))) {
        if(data->state.scratch == NULL)
          data->state.scratch = malloc(2*BUFSIZE);
        if(data->state.scratch == NULL) {
          failf (data, "Failed to alloc scratch buffer!");
          return CURLE_OUT_OF_MEMORY;
        }
        /*
         * ASCII/EBCDIC Note: This is presumably a text (not binary)
         * transfer so the data should already be in ASCII.
         * That means the hex values for ASCII CR (0x0d) & LF (0x0a)
         * must be used instead of the escape sequences \r & \n.
         */
        for(i = 0, si = 0; i < nread; i++, si++) {
          if(data->req.upload_fromhere[i] == 0x0a) {
            data->state.scratch[si++] = 0x0d;
            data->state.scratch[si] = 0x0a;
            if(!data->set.crlf) {
              /* we're here only because FTP is in ASCII mode...
                 bump infilesize for the LF we just added */
              data->state.infilesize++;
            }
          }
          else
            data->state.scratch[si] = data->req.upload_fromhere[i];
        }
        if(si != nread) {
          /* only perform the special operation if we really did replace
             anything */
          nread = si;

          /* upload from the new (replaced) buffer instead */
          data->req.upload_fromhere = data->state.scratch;

          /* set the new amount too */
          data->req.upload_present = nread;
        }
      }
    } /* if 0 == data->req.upload_present */
    else {
      /* We have a partial buffer left from a previous "round". Use
         that instead of reading more data */
    }

    /* write to socket (send away data) */
    result = Curl_write(conn,
                        conn->writesockfd,     /* socket to send to */
                        data->req.upload_fromhere, /* buffer pointer */
                        data->req.upload_present,  /* buffer size */
                        &bytes_written);           /* actually sent */

    if(result)
      return result;

    if(data->set.verbose)
      /* show the data before we change the pointer upload_fromhere */
      Curl_debug(data, CURLINFO_DATA_OUT, data->req.upload_fromhere,
                 (size_t)bytes_written, conn);

    k->writebytecount += bytes_written;

    if(k->writebytecount == data->state.infilesize) {
      /* we have sent all data we were supposed to */
      k->upload_done = TRUE;
      infof(data, "We are completely uploaded and fine\n");
    }

    if(data->req.upload_present != bytes_written) {
      /* we only wrote a part of the buffer (if anything), deal with it! */

      /* store the amount of bytes left in the buffer to write */
      data->req.upload_present -= bytes_written;

      /* advance the pointer where to find the buffer when the next send
         is to happen */
      data->req.upload_fromhere += bytes_written;
    }
    else {
      /* we've uploaded that buffer now */
      data->req.upload_fromhere = k->uploadbuf;
      data->req.upload_present = 0; /* no more bytes left */

      if(k->upload_done) {
        /* switch off writing, we're done! */
        k->keepon &= ~KEEP_SEND; /* we're done writing */
      }
    }

    Curl_pgrsSetUploadCounter(data, k->writebytecount);

  } WHILE_FALSE; /* just to break out from! */

  return CURLE_OK;
}